

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall
wasm::WasmBinaryWriter::writeDebugLocation(WasmBinaryWriter *this,DebugLocation *loc)

{
  DebugLocation *other;
  optional<unsigned_int> *poVar1;
  undefined3 uVar2;
  BinaryLocation BVar3;
  BinaryLocation BVar4;
  _Storage<unsigned_int,_true> _Var5;
  bool bVar6;
  unsigned_long local_30;
  size_type offset;
  
  other = &this->lastDebugLocation;
  bVar6 = Function::DebugLocation::operator==(loc,other);
  if (!bVar6) {
    local_30 = (long)(this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    offset = (size_type)loc;
    std::
    vector<std::pair<unsigned_long,wasm::Function::DebugLocation_const*>,std::allocator<std::pair<unsigned_long,wasm::Function::DebugLocation_const*>>>
    ::emplace_back<unsigned_long&,wasm::Function::DebugLocation_const*>
              ((vector<std::pair<unsigned_long,wasm::Function::DebugLocation_const*>,std::allocator<std::pair<unsigned_long,wasm::Function::DebugLocation_const*>>>
                *)&this->sourceMapLocations,&local_30,(DebugLocation **)&offset);
    uVar2 = *(undefined3 *)
             &(loc->symbolNameIndex).super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>.field_0x5;
    poVar1 = &(this->lastDebugLocation).symbolNameIndex;
    (poVar1->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
    super__Optional_payload_base<unsigned_int>._M_engaged =
         (loc->symbolNameIndex).super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_engaged;
    *(undefined3 *)
     &(poVar1->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
      super__Optional_payload_base<unsigned_int>.field_0x5 = uVar2;
    BVar3 = loc->lineNumber;
    BVar4 = loc->columnNumber;
    _Var5 = (loc->symbolNameIndex).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload;
    other->fileIndex = loc->fileIndex;
    other->lineNumber = BVar3;
    (this->lastDebugLocation).columnNumber = BVar4;
    (this->lastDebugLocation).symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>.
    _M_payload.super__Optional_payload_base<unsigned_int>._M_payload = _Var5;
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeDebugLocation(const Function::DebugLocation& loc) {
  if (loc == lastDebugLocation) {
    return;
  }
  auto offset = o.size();
  sourceMapLocations.emplace_back(offset, &loc);
  lastDebugLocation = loc;
}